

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qasm.cpp
# Opt level: O2

int timings<std::complex<float>>(string *filename,int test)

{
  ostream *poVar1;
  allocator_type local_281;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  time;
  vector<std::complex<float>,_std::allocator<std::complex<float>_>_> psi;
  _Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_> local_250;
  string local_238;
  value_type local_218;
  string local_210;
  QCircuit<std::complex<float>,_qclab::QObject<std::complex<float>_>_> circuit;
  string local_1c0;
  stringstream qasm;
  ostream local_190 [376];
  
  time.__d.__r = (duration)0;
  std::__cxx11::string::string((string *)&local_1c0,(string *)filename);
  qclab::QCircuit<std::complex<float>,_qclab::QObject<std::complex<float>_>_>::QCircuit
            (&circuit,&local_1c0,0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::stringstream::stringstream((stringstream *)&qasm);
  qclab::QCircuit<std::complex<float>,_qclab::QObject<std::complex<float>_>_>::toQASM
            (&circuit,local_190,0);
  poVar1 = std::operator<<((ostream *)&std::cout,"\nqasm:\n");
  std::__cxx11::stringbuf::str();
  poVar1 = std::operator<<(poVar1,(string *)&psi);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&psi);
  psi.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  psi.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  psi.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if ((test & 0xfffffffdU) == 1) {
    poVar1 = std::operator<<((ostream *)&std::cout,"CPU");
    std::endl<char,std::char_traits<char>>(poVar1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_210,"  * initialize ket0:",(allocator<char> *)&local_250);
    tic(&local_210,&time);
    std::__cxx11::string::~string((string *)&local_210);
    local_218._M_value = 0;
    std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::vector
              ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)&local_250,
               1L << ((byte)circuit.nbQubits_ & 0x3f),&local_218,&local_281);
    std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::_M_move_assign
              (&psi,&local_250);
    std::_Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>::~_Vector_base
              (&local_250);
    (psi.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>._M_impl.
     super__Vector_impl_data._M_start)->_M_value = 0x3f800000;
    toc(&time);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"  * simulate qft circuit:",(allocator<char> *)&local_250);
    tic(&local_238,&time);
    std::__cxx11::string::~string((string *)&local_238);
    qclab::QCircuit<std::complex<float>,_qclab::QObject<std::complex<float>_>_>::simulate
              (&circuit,&psi);
    toc(&time);
  }
  std::_Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>::~_Vector_base
            (&psi.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>);
  std::__cxx11::stringstream::~stringstream((stringstream *)&qasm);
  qclab::QCircuit<std::complex<float>,_qclab::QObject<std::complex<float>_>_>::~QCircuit(&circuit);
  return 0;
}

Assistant:

int timings( const std::string& filename , const int test ) {

  using R = qclab::real_t< T > ;
  const R tol = 10 * std::numeric_limits< R >::epsilon() ;

  // timing variable
  std::chrono::time_point< std::chrono::high_resolution_clock > time ;

  // quantum circuit
  qclab::QCircuit< T > circuit( filename ) ;
  std::stringstream qasm ;
  circuit.toQASM( qasm ) ;
  std::cout << "\nqasm:\n" << qasm.str() << std::endl ;

  // vector size
  const size_t N = size_t(1) << circuit.nbQubits() ;

  // simulate on CPU
  std::vector< T > psi ;
  if ( test == 1 || test == 3 ) {
    std::cout << "CPU" << std::endl ;
    // all zero state
    tic( "  * initialize ket0:" , time ) ;
    psi = std::vector< T >( N , T(0) ) ;
    psi[0] = 1 ;
    toc( time ) ;
    // simulate
    tic( "  * simulate qft circuit:" , time ) ;
    circuit.simulate( psi ) ;
    toc( time ) ;
  }

  // simulate on GPU
  if ( test == 2 || test == 3 ) {
  #ifdef QCLAB_OMP_OFFLOADING
    std::cout << "GPU" << std::endl ;
    std::vector< T > phi( N ) ; T* phi_ = phi.data() ;
    #pragma omp target enter data map(alloc:phi_[0:N])
    // all zero state
    tic( "  * initialize ket0:" , time ) ;
    #pragma omp target
    {
      phi_[0] = 1 ;
      #pragma omp parallel for
      for ( size_t i = 1; i < N; i++ ) {
        phi_[i] = 0 ;
      }
    }
    toc( time ) ;
    // simulate
    tic( "  * simulate qft circuit:" , time ) ;
    circuit.simulate_device( phi_ ) ;
    toc( time ) ;
    // check
    if ( test == 3 ) {
      #pragma omp target update from(phi_[0:N])
      #pragma omp target exit data map(delete:phi_[0:N])
      for ( size_t i = 0; i < N; i++ ) {
        if ( std::abs( psi[i] - phi[i] ) > tol ) {
          std::cout << " *** CHECK FAILED! ***" << std::endl ;
          return -1 ;
        }
      }
      std::cout << "Check passed." << std::endl ;
    }
  #endif
  }

  // successful
  return 0 ;

}